

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

void __thiscall smf::MidiEventList::clear(MidiEventList *this)

{
  pointer ppMVar1;
  MidiEvent *this_00;
  int i;
  long lVar2;
  
  for (lVar2 = 0;
      ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(this->list).
                                  super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar1) >> 3);
      lVar2 = lVar2 + 1) {
    this_00 = ppMVar1[lVar2];
    if (this_00 != (MidiEvent *)0x0) {
      MidiEvent::~MidiEvent(this_00);
      operator_delete(this_00);
      (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar2] = (MidiEvent *)0x0;
    }
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(&this->list,0);
  return;
}

Assistant:

void MidiEventList::clear(void) {
	for (int i=0; i<(int)list.size(); i++) {
		if (list[i] != NULL) {
			delete list[i];
			list[i] = NULL;
		}
	}
	list.resize(0);
}